

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O3

void MIDIStreamer::Callback(uint uMsg,void *userdata,DWORD dwParam1,DWORD dwParam2)

{
  if ((uMsg == 0x3c9) && (*(int *)((long)userdata + 0xc4c) < 4)) {
    ServiceEvent((MIDIStreamer *)userdata);
    return;
  }
  return;
}

Assistant:

void MIDIStreamer::Callback(unsigned int uMsg, void *userdata, DWORD dwParam1, DWORD dwParam2)
{
	MIDIStreamer *self = (MIDIStreamer *)userdata;

	if (self->EndQueued >= 4)
	{
		return;
	}
	if (uMsg == MOM_DONE)
	{
#ifdef _WIN32
		if (self->PlayerThread != NULL)
		{
			SetEvent(self->BufferDoneEvent);
		}
		else
#endif
		{
			self->ServiceEvent();
		}
	}
}